

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbuspendingcall_p.h
# Opt level: O0

void __thiscall
QDBusPendingCallWatcherHelper::emitSignals
          (QDBusPendingCallWatcherHelper *this,QDBusMessage *replyMessage,QDBusMessage *sentMessage)

{
  long lVar1;
  MessageType MVar2;
  QDBusError *in_RDX;
  QDBusError *in_RSI;
  QDBusError *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MVar2 = QDBusMessage::type((QDBusMessage *)in_RSI);
  if (MVar2 == ReplyMessage) {
    reply((QDBusPendingCallWatcherHelper *)in_RDX,(QDBusMessage *)in_RDI);
  }
  else {
    QDBusError::QDBusError(in_RSI,(QDBusMessage *)in_RDX);
    error((QDBusPendingCallWatcherHelper *)in_RDX,in_RDI,(QDBusMessage *)0x175d0f);
    QDBusError::~QDBusError(in_RDX);
  }
  finished((QDBusPendingCallWatcherHelper *)0x175d22);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emitSignals(const QDBusMessage &replyMessage, const QDBusMessage &sentMessage)
    {
        if (replyMessage.type() == QDBusMessage::ReplyMessage)
            emit reply(replyMessage);
        else
            emit error(QDBusError(replyMessage), sentMessage);
        emit finished();
    }